

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

int __thiscall Fl_Text_Buffer::insertfile(Fl_Text_Buffer *this,char *file,int pos,int buflen)

{
  bool bVar1;
  FILE *__stream;
  wchar_t wVar2;
  uint ucs;
  wchar_t wVar3;
  char *text;
  size_t sVar4;
  int pos_00;
  char *__dest;
  char *p;
  int iVar5;
  char *pcVar6;
  int lp;
  char multibyte [5];
  char line [100];
  char *local_f0;
  wchar_t local_dc;
  char *local_d8;
  FILE *local_d0;
  Fl_Text_Buffer *local_c8;
  ulong local_c0;
  char *local_b8;
  ulong local_b0;
  long local_a8;
  char local_9d [5];
  char local_98 [100];
  undefined1 local_34 [4];
  
  local_d0 = (FILE *)fl_fopen(file,"r");
  if (local_d0 == (FILE *)0x0) {
    return 1;
  }
  local_c0 = (ulong)(uint)pos;
  text = (char *)operator_new__((long)(buflen + 1));
  this->input_file_was_transcoded = 0;
  local_b8 = text + buflen;
  local_f0 = local_98;
  local_d8 = text;
  local_c8 = this;
  local_b0 = (ulong)(uint)buflen;
  do {
    p = local_98;
    __dest = text;
    if (0 < (int)local_b0) {
      do {
        if (local_f0 <= p) {
          sVar4 = fread(local_98,1,100,local_d0);
          local_f0 = local_98 + (int)sVar4;
          p = local_98;
          if ((int)sVar4 == 0) goto LAB_001d07f0;
        }
        wVar2 = fl_utf8len1(*p);
        if (local_f0 < p + wVar2) {
          local_a8 = (long)wVar2;
          memmove(local_98,p,(long)local_f0 - (long)p);
          local_f0 = local_f0 + ((long)local_98 - (long)p);
          sVar4 = fread(local_f0,1,(size_t)(local_34 + -(long)local_f0),local_d0);
          local_f0 = local_f0 + (int)sVar4;
          p = local_98;
          text = local_d8;
          if ((long)local_f0 - (long)local_98 < local_a8) break;
        }
        pcVar6 = __dest;
        if (L'\0' < wVar2) {
          do {
            ucs = fl_utf8decode(p,p + (uint)wVar2,&local_dc);
            wVar3 = fl_utf8encode(ucs,local_9d);
            if ((local_dc != wVar2) || (wVar3 != wVar2)) {
              local_c8->input_file_was_transcoded = 1;
            }
            pcVar6 = __dest + wVar3;
            text = local_d8;
            if (local_b8 < pcVar6) goto LAB_001d07d6;
            memcpy(__dest,local_9d,(long)wVar3);
            p = p + local_dc;
            wVar3 = wVar2 - local_dc;
            bVar1 = local_dc <= wVar2;
            __dest = pcVar6;
            wVar2 = wVar3;
          } while (wVar3 != L'\0' && bVar1);
        }
        text = local_d8;
        __dest = pcVar6;
      } while (pcVar6 < local_b8);
    }
LAB_001d07d6:
    memmove(local_98,p,(long)local_f0 - (long)p);
    local_f0 = local_f0 + ((long)local_98 - (long)p);
LAB_001d07f0:
    __stream = local_d0;
    iVar5 = (int)__dest - (int)text;
    if (iVar5 == 0) {
      iVar5 = ferror(local_d0);
      fclose(__stream);
      operator_delete__(text);
      if (((iVar5 == 0) && (local_c8->input_file_was_transcoded != 0)) &&
         (local_c8->transcoding_warning_action != (_func_void_Fl_Text_Buffer_ptr *)0x0)) {
        (*local_c8->transcoding_warning_action)(local_c8);
      }
      return (uint)(iVar5 != 0) * 2;
    }
    text[iVar5] = '\0';
    pos_00 = (int)local_c0;
    insert(local_c8,pos_00,text);
    local_c0 = (ulong)(uint)(pos_00 + iVar5);
  } while( true );
}

Assistant:

int Fl_Text_Buffer::insertfile(const char *file, int pos, int buflen)
{
  FILE *fp;
  if (!(fp = fl_fopen(file, "r")))
    return 1;
  char *buffer = new char[buflen + 1];  
  char *endline, line[100];
  int l;
  input_file_was_transcoded = false;
  endline = line;
  while (true) {
#ifdef EXAMPLE_ENCODING
    // example of 16-bit encoding: UTF-16
    l = general_input_filter(buffer, buflen, 
				  line, sizeof(line), endline, 
				  utf16toucs, // use cp1252toucs to read CP1252-encoded files
				  fp);
    input_file_was_transcoded = true;
#else
    l = utf8_input_filter(buffer, buflen, line, sizeof(line), endline, 
			  fp, &input_file_was_transcoded);
#endif
    if (l == 0) break;
    buffer[l] = 0;
    insert(pos, buffer);
    pos += l;
  }
  int e = ferror(fp) ? 2 : 0;
  fclose(fp);
  delete[]buffer;
  if ( (!e) && input_file_was_transcoded && transcoding_warning_action) {
    transcoding_warning_action(this);
  }
  return e;
}